

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O2

bool fast_float::long_mul<(unsigned_short)62>(stackvec<(unsigned_short)62> *x,limb_span y)

{
  limb y_00;
  bool bVar1;
  size_t in_R8;
  size_t index;
  size_t sVar2;
  limb_span s;
  limb_span s_00;
  limb_span y_01;
  stackvec<(unsigned_short)62> local_420;
  stackvec<(unsigned_short)62> z;
  
  s.length._0_2_ = x->length;
  s.ptr = x->data;
  s.length._2_6_ = 0;
  stackvec<(unsigned_short)62>::stackvec(&z,s);
  if (y.length != 0) {
    bVar1 = small_mul<(unsigned_short)62>(x,*y.ptr);
    if (!bVar1) {
      return false;
    }
    for (sVar2 = 1; y.length != sVar2; sVar2 = sVar2 + 1) {
      y_00 = y.ptr[sVar2];
      if (y_00 != 0) {
        local_420.length = 0;
        s_00.length._0_2_ = z.length;
        s_00.ptr = z.data;
        s_00.length._2_6_ = 0;
        bVar1 = stackvec<(unsigned_short)62>::try_extend(&local_420,s_00);
        if (!bVar1) {
          return false;
        }
        bVar1 = small_mul<(unsigned_short)62>(&local_420,y_00);
        if (!bVar1) {
          return false;
        }
        y_01.ptr = (unsigned_long *)(ulong)local_420.length;
        y_01.length = sVar2;
        bVar1 = large_add_from<(unsigned_short)62>((fast_float *)x,&local_420,y_01,in_R8);
        if (!bVar1) {
          return false;
        }
      }
    }
  }
  stackvec<(unsigned_short)62>::normalize(x);
  return true;
}

Assistant:

FASTFLOAT_CONSTEXPR20
bool long_mul(stackvec<size>& x, limb_span y) noexcept {
  limb_span xs = limb_span(x.data, x.len());
  stackvec<size> z(xs);
  limb_span zs = limb_span(z.data, z.len());

  if (y.len() != 0) {
    limb y0 = y[0];
    FASTFLOAT_TRY(small_mul(x, y0));
    for (size_t index = 1; index < y.len(); index++) {
      limb yi = y[index];
      stackvec<size> zi;
      if (yi != 0) {
        // re-use the same buffer throughout
        zi.set_len(0);
        FASTFLOAT_TRY(zi.try_extend(zs));
        FASTFLOAT_TRY(small_mul(zi, yi));
        limb_span zis = limb_span(zi.data, zi.len());
        FASTFLOAT_TRY(large_add_from(x, zis, index));
      }
    }
  }

  x.normalize();
  return true;
}